

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void update_data_from_objs(Am_Value *objs_value,Am_Value *new_data_value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  Am_Object obj;
  Am_Value_List objs_list;
  Am_Object owner;
  Am_Object local_60;
  Am_Value *local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List new_data_list;
  
  obj.data = (Am_Object_Data *)0x0;
  owner.data = (Am_Object_Data *)0x0;
  local_58 = new_data_value;
  bVar1 = Am_Value_List::Test(objs_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&objs_list);
    Am_Value_List::Am_Value_List(&new_data_list);
    Am_Value_List::operator=(&objs_list,objs_value);
    Am_Value_List::Start(&objs_list);
    while( true ) {
      bVar1 = Am_Value_List::Last(&objs_list);
      if (bVar1) break;
      pAVar6 = Am_Value_List::Get(&objs_list);
      Am_Object::operator=(&obj,pAVar6);
      Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)&obj);
      Am_Object::operator=(&owner,&local_48);
      Am_Object::~Am_Object(&local_48);
      pAVar6 = Am_Object::Get(&obj,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&obj,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&obj,0x66,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&obj,0x67,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Object::Am_Object(&local_50,&owner);
      Am_Inter_Location::Am_Inter_Location
                ((Am_Inter_Location *)&local_48,false,&local_50,iVar2,iVar3,iVar4,iVar5,true,true);
      pAVar7 = Am_Inter_Location::operator_cast_to_Am_Wrapper_((Am_Inter_Location *)&local_48);
      Am_Value_List::Add(&new_data_list,pAVar7,Am_TAIL,true);
      Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_48);
      Am_Object::~Am_Object(&local_50);
      Am_Value_List::Next(&objs_list);
    }
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_data_list);
    Am_Value::operator=(local_58,pAVar7);
    Am_Value_List::~Am_Value_List(&new_data_list);
    Am_Value_List::~Am_Value_List(&objs_list);
  }
  else {
    bVar1 = Am_Object::Test(objs_value);
    if (!bVar1) {
      Am_Error("objs not a list or object");
    }
    Am_Object::operator=(&obj,objs_value);
    Am_Object::Get_Owner((Am_Object *)&objs_list,(Am_Slot_Flags)&obj);
    Am_Object::operator=(&owner,(Am_Object *)&objs_list);
    Am_Object::~Am_Object((Am_Object *)&objs_list);
    pAVar6 = Am_Object::Get(&obj,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&obj,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&obj,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&obj,0x67,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Am_Object(&local_60,&owner);
    Am_Inter_Location::Am_Inter_Location
              ((Am_Inter_Location *)&objs_list,false,&local_60,iVar2,iVar3,iVar4,iVar5,true,true);
    Am_Object::~Am_Object(&local_60);
    pAVar7 = Am_Inter_Location::operator_cast_to_Am_Wrapper_((Am_Inter_Location *)&objs_list);
    Am_Value::operator=(local_58,pAVar7);
    Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&objs_list);
  }
  Am_Object::~Am_Object(&owner);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

void
update_data_from_objs(Am_Value objs_value, Am_Value &new_data_value)
{
  Am_Object obj, owner;
  int left, top, w, h;
  if (Am_Value_List::Test(objs_value)) {
    Am_Value_List objs_list, new_data_list;
    objs_list = objs_value;
    for (objs_list.Start(); !objs_list.Last(); objs_list.Next()) {
      obj = objs_list.Get();
      owner = obj.Get_Owner();
      left = obj.Get(Am_LEFT);
      top = obj.Get(Am_TOP);
      w = obj.Get(Am_WIDTH);
      h = obj.Get(Am_HEIGHT);
      new_data_list.Add(Am_Inter_Location(false, owner, left, top, w, h));
    }
    new_data_value = new_data_list;
  } else if (Am_Object::Test(objs_value)) {
    obj = objs_value;
    owner = obj.Get_Owner();
    left = obj.Get(Am_LEFT);
    top = obj.Get(Am_TOP);
    w = obj.Get(Am_WIDTH);
    h = obj.Get(Am_HEIGHT);
    Am_Inter_Location new_data(false, owner, left, top, w, h);
    new_data_value = new_data;
  } else
    Am_Error("objs not a list or object");
}